

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O1

_Bool monster_attack_monster(monster_conflict *mon,monster_conflict *t_mon)

{
  loc grid;
  monster_race *pmVar1;
  monster_blow *pmVar2;
  blow_method *pbVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  byte bVar7;
  _Bool _Var8;
  _Bool _Var9;
  int iVar10;
  wchar_t timer;
  uint32_t uVar11;
  monster_lore *lore;
  melee_effect_handler_f p_Var12;
  monster *pmVar13;
  wchar_t rlev;
  byte bVar14;
  wchar_t wVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  source sVar19;
  source origin;
  random_value v;
  random_value dice;
  melee_effect_handler_context_t context;
  char m_name [80];
  char t_name [80];
  
  lore = get_lore(mon->race);
  wVar15 = mon->race->level;
  rlev = L'\x01';
  if (L'\x01' < wVar15) {
    rlev = wVar15;
  }
  _Var8 = flag_has_dbg(mon->race->flags,0xc,0x1a,"mon->race->flags","RF_NEVER_BLOW");
  if (!_Var8) {
    monster_desc(m_name,0x50,(monster *)mon,L'̔');
    monster_desc(t_name,0x50,(monster *)t_mon,L'\x15');
    if (z_info->mon_blows_max != 0) {
      lVar17 = 0;
      uVar16 = 0;
      bVar7 = 0;
      do {
        grid = t_mon->grid;
        _Var9 = monster_is_visible((monster *)mon);
        bVar18 = true;
        if (!_Var9) {
          bVar18 = L'\0' < mon->race->light;
        }
        pmVar1 = mon->race;
        pmVar2 = pmVar1->blow;
        pbVar3 = *(blow_method **)((long)&pmVar2->method + lVar17);
        if (pbVar3 == (blow_method *)0x0) {
          bVar18 = false;
        }
        else {
          puVar4 = *(undefined8 **)((long)&pmVar2->effect + lVar17);
          if (puVar4 == (undefined8 *)0x0) {
            __assert_fail("effect",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-attack.c"
                          ,0x362,"_Bool monster_attack_monster(struct monster *, struct monster *)")
            ;
          }
          uVar5 = *(undefined8 *)((long)&(pmVar2->dice).base + lVar17);
          uVar6 = *(undefined8 *)((long)&(pmVar2->dice).sides + lVar17);
          iVar10 = strcmp((char *)*puVar4,"NONE");
          if (iVar10 == 0) {
LAB_0016f4cb:
            _Var9 = pbVar3->stun;
            v.sides = (int)uVar6;
            v.m_bonus = (int)((ulong)uVar6 >> 0x20);
            v.base = (int)uVar5;
            v.dice = (int)((ulong)uVar5 >> 0x20);
            wVar15 = randcalc(v,rlev,RANDOMISE);
            if (mon->m_timed[1] != 0) {
              wVar15 = (wVar15 * 0x4b) / 100;
            }
            p_Var12 = melee_handler_for_blow_effect((char *)*puVar4);
            if (p_Var12 == (melee_effect_handler_f)0x0) {
              msg("ERROR: Effect handler not found for %s.",*puVar4);
              bVar14 = 1;
            }
            else {
              context.p = (player *)0x0;
              context.ac = t_mon->race->ac;
              context.ddesc = (char *)0x0;
              context.obvious = true;
              context.blinked = (_Bool)(bVar7 & 1);
              context.m_name = m_name;
              context.mon = mon;
              context.t_mon = t_mon;
              context.rlev = rlev;
              context.method = pbVar3;
              context.damage = wVar15;
              (*p_Var12)(&context);
              wVar15 = context.damage;
              bVar14 = context.obvious;
              bVar7 = context.blinked;
            }
            if ((_Var9 != false) && (pmVar13 = square_monster(cave,grid), pmVar13 != (monster *)0x0)
               ) {
              dice.sides = (int)uVar6;
              dice.m_bonus = (int)((ulong)uVar6 >> 0x20);
              dice.base = (int)uVar5;
              dice.dice = (int)((ulong)uVar5 >> 0x20);
              timer = monster_critical(dice,rlev,wVar15);
              switch(timer) {
              case L'\0':
                break;
              case L'\x01':
                uVar11 = Rand_div(5);
                timer = uVar11 + L'\x01';
                break;
              case L'\x02':
                uVar11 = Rand_div(10);
                timer = uVar11 + L'\v';
                break;
              case L'\x03':
                uVar11 = Rand_div(0x14);
                timer = uVar11 + L'\x15';
                break;
              case L'\x04':
                uVar11 = Rand_div(0x1e);
                timer = uVar11 + L'\x1f';
                break;
              case L'\x05':
                uVar11 = Rand_div(0x28);
                timer = uVar11 + L')';
                break;
              case L'\x06':
                timer = L'd';
                break;
              default:
                timer = L'È';
              }
              if (timer != L'\0') {
                mon_inc_timed((monster *)t_mon,L'\x01',timer,L'\0');
              }
            }
            bVar14 = bVar14 | wVar15 != L'\0';
          }
          else {
            wVar15 = pmVar1->level;
            iVar10 = wVar15 * 3;
            if (wVar15 < L'\x01') {
              iVar10 = 3;
            }
            wVar15 = iVar10 + *(int *)(puVar4 + 1);
            if (mon->m_timed[1] != 0) {
              wVar15 = (wVar15 * 0x4b) / 100;
            }
            _Var9 = test_hit(wVar15,t_mon->race->ac);
            if (_Var9) goto LAB_0016f4cb;
            _Var9 = monster_is_visible((monster *)mon);
            if ((_Var9) && (pbVar3->miss == true)) {
              msg("%s misses %s.",m_name,t_name);
            }
            bVar14 = 0;
          }
          if ((bVar18) &&
             ((bVar14 != 0 || (10 < *(int *)((long)&lore->blows->times_seen + lVar17))))) {
            iVar10 = *(int *)((long)&lore->blows->times_seen + lVar17);
            if (iVar10 < 0xff) {
              *(int *)((long)&lore->blows->times_seen + lVar17) = iVar10 + 1;
            }
          }
          pmVar13 = square_monster(cave,grid);
          bVar18 = pmVar13 != (monster *)0x0;
        }
        if (!bVar18) break;
        uVar16 = uVar16 + 1;
        lVar17 = lVar17 + 0x30;
      } while (uVar16 < z_info->mon_blows_max);
      if ((bVar7 & 1) != 0) {
        _Var9 = square_isseen(cave,mon->grid);
        if (_Var9) {
          add_monster_message(mon,L'7',true);
        }
        strnfmt((char *)&context,5,"%d",(ulong)((uint)z_info->max_sight * 2 + 5));
        sVar19 = source_monster(mon->midx);
        origin.which = sVar19.which;
        origin._4_4_ = 0;
        origin.what = sVar19.what;
        effect_simple(L';',origin,(char *)&context,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
      }
    }
    lore_update(mon->race,lore);
  }
  return !_Var8;
}

Assistant:

bool monster_attack_monster(struct monster *mon, struct monster *t_mon)
{
	struct monster_lore *lore = get_lore(mon->race);
	int rlev = ((mon->race->level >= 1) ? mon->race->level : 1);
	int ap_cnt;
	char m_name[80];
	char t_name[80];
	bool blinked = false;

	/* Not allowed to attack */
	if (rf_has(mon->race->flags, RF_NEVER_BLOW)) return (false);

	/* Get the monster names (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);
	monster_desc(t_name, sizeof(t_name), t_mon, MDESC_TARG);

	/* Scan through all blows */
	for (ap_cnt = 0; ap_cnt < z_info->mon_blows_max; ap_cnt++) {
		struct loc grid = t_mon->grid;
		bool visible = monster_is_visible(mon) || (mon->race->light > 0);
		bool obvious = false;

		int damage = 0;
		bool do_stun = false;

		/* Extract the attack infomation */
		struct blow_effect *effect = mon->race->blow[ap_cnt].effect;
		struct blow_method *method = mon->race->blow[ap_cnt].method;
		random_value dice = mon->race->blow[ap_cnt].dice;

		/* No more attacks */
		if (!method) break;

		/* Monster hits monster */
		assert(effect);
		if (streq(effect->name, "NONE") ||
			test_hit(chance_of_monster_hit(mon, effect), t_mon->race->ac)) {
			melee_effect_handler_f effect_handler;

			do_stun = method->stun;

			/* Hack -- assume all attacks are obvious */
			obvious = true;

			/* Roll dice */
			damage = randcalc(dice, rlev, RANDOMISE);

			/* Reduce damage when stunned */
			if (mon->m_timed[MON_TMD_STUN]) {
				damage = (damage * (100 - STUN_DAM_REDUCTION)) / 100;
			}

			/* Perform the actual effect. */
			effect_handler = melee_handler_for_blow_effect(effect->name);
			if (effect_handler != NULL) {
				melee_effect_handler_context_t context = {
					NULL,
					mon,
					t_mon,
					rlev,
					method,
					t_mon->race->ac,
					NULL,
					obvious,
					blinked,
					damage,
					m_name
				};

				effect_handler(&context);

				/* Save any changes made in the handler for later use. */
				obvious = context.obvious;
				blinked = context.blinked;
				damage = context.damage;
			} else {
				msg("ERROR: Effect handler not found for %s.", effect->name);
			}

			/* Handle stun */
			if (do_stun && square_monster(cave, grid)) {
				/* Critical hit (zero if non-critical) */
				int amt, tmp = monster_critical(dice, rlev, damage);

				/* Roll for damage */
				switch (tmp) {
					case 0: amt = 0; break;
					case 1: amt = randint1(5); break;
					case 2: amt = randint1(10) + 10; break;
					case 3: amt = randint1(20) + 20; break;
					case 4: amt = randint1(30) + 30; break;
					case 5: amt = randint1(40) + 40; break;
					case 6: amt = 100; break;
					default: amt = 200; break;
				}

				/* Apply the stun */
				if (amt)
					(void)mon_inc_timed(t_mon, MON_TMD_STUN, amt, 0);
			}
		} else {
			/* Visible monster missed monster, so notify if appropriate. */
			if (monster_is_visible(mon) && method->miss) {
				msg("%s misses %s.", m_name, t_name);
			}
		}

		/* Analyze "visible" monsters only */
		if (visible) {
			/* Count "obvious" attacks (and ones that cause damage) */
			if (obvious || damage || (lore->blows[ap_cnt].times_seen > 10)) {
				/* Count attacks of this type */
				if (lore->blows[ap_cnt].times_seen < UCHAR_MAX)
					lore->blows[ap_cnt].times_seen++;
			}
		}

		/* Skip the other blows if the target has moved or died */
		if (!square_monster(cave, grid)) break;
	}

	/* Blink away */
	if (blinked) {
		char dice[5];

		if (square_isseen(cave, mon->grid)) {
			add_monster_message(mon, MON_MSG_HIT_AND_RUN, true);
		}
		strnfmt(dice, sizeof(dice), "%d", z_info->max_sight * 2 + 5);
		effect_simple(EF_TELEPORT, source_monster(mon->midx), dice, 0, 0, 0, 0, 0, NULL);
	}

	/* Learn lore */
	lore_update(mon->race, lore);

	/* Assume we attacked */
	return (true);
}